

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void small_suite::test_minus_one(void)

{
  return_type rVar1;
  value_type input [1];
  undefined4 local_60;
  value local_5c;
  decoder decoder;
  
  input[0] = 0xff;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[1]>(&decoder,&input);
  local_5c = decoder.current.code;
  local_60 = 0xa0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7c,"void small_suite::test_minus_one()",&local_5c,&local_60);
  rVar1 = trial::protocol::bintoken::detail::decoder::
          overloader<trial::protocol::bintoken::token::int8>::decode(&decoder);
  local_60 = CONCAT31(local_60._1_3_,rVar1);
  local_5c = ~end;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,int>
            ("decoder.value<token::int8>()","-1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7d,"void small_suite::test_minus_one()",&local_60,&local_5c);
  trial::protocol::bintoken::detail::decoder::next(&decoder);
  local_5c = decoder.current.code;
  local_60 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7f,"void small_suite::test_minus_one()",&local_5c,&local_60);
  return;
}

Assistant:

void test_minus_one()
{
    const value_type input[] = { 0xFF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::int8>(), -1);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}